

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O2

int Abc_NtkSizeOfGlobalBdds(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  DdNode **nodeArray;
  Abc_Obj_t *pObj;
  DdNode *pDVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = pNtk->vCos->nSize;
  p = (Vec_Ptr_t *)malloc(0x10);
  uVar4 = 8;
  if (6 < uVar6 - 1) {
    uVar4 = (ulong)uVar6;
  }
  p->nSize = 0;
  iVar1 = (int)uVar4;
  p->nCap = iVar1;
  if (iVar1 == 0) {
    nodeArray = (DdNode **)0x0;
  }
  else {
    nodeArray = (DdNode **)malloc((long)iVar1 << 3);
  }
  p->pArray = nodeArray;
  lVar5 = 0;
  while (iVar1 = (int)lVar5, iVar1 < (int)uVar6) {
    pObj = Abc_NtkCo(pNtk,iVar1);
    pDVar2 = (DdNode *)Abc_ObjGlobalBdd(pObj);
    iVar3 = (int)uVar4;
    if (iVar1 == iVar3) {
      uVar7 = (ulong)(uint)(iVar3 * 2);
      if (iVar3 < 0x10) {
        uVar7 = 0x10;
      }
      if (iVar3 < (int)uVar7) {
        if (nodeArray == (DdNode **)0x0) {
          nodeArray = (DdNode **)malloc(uVar7 << 3);
        }
        else {
          nodeArray = (DdNode **)realloc(nodeArray,uVar7 << 3);
        }
        p->pArray = nodeArray;
        p->nCap = (int)uVar7;
        uVar4 = uVar7;
      }
    }
    p->nSize = (int)(lVar5 + 1);
    nodeArray[lVar5] = pDVar2;
    lVar5 = lVar5 + 1;
    uVar6 = pNtk->vCos->nSize;
  }
  iVar1 = Cudd_SharingSize(nodeArray,iVar1);
  Vec_PtrFree(p);
  return iVar1;
}

Assistant:

int Abc_NtkSizeOfGlobalBdds( Abc_Ntk_t * pNtk ) 
{
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;
    int RetValue, i;
    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );
    RetValue = Cudd_SharingSize( (DdNode **)Vec_PtrArray(vFuncsGlob), Vec_PtrSize(vFuncsGlob) );
    Vec_PtrFree( vFuncsGlob );
    return RetValue;
}